

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O0

void __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::standard_hash_table
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this,uint32_t capa_bits)

{
  uint *puVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  long in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_type in_stack_ffffffffffffffd8;
  vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  *in_stack_ffffffffffffffe0;
  uint64_t uStack_18;
  uint local_c [3];
  
  std::
  vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ::vector((vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
            *)0x19d314);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  size_p2::size_p2((size_p2 *)(in_RDI + 0x28));
  puVar1 = std::max<unsigned_int>(&min_capa_bits,local_c);
  size_p2::size_p2((size_p2 *)&stack0xffffffffffffffe0,*puVar1);
  auVar4._8_8_ = uStack_18;
  auVar4._0_8_ = in_stack_ffffffffffffffe0;
  *(undefined1 (*) [16])(in_RDI + 0x28) = auVar4;
  uVar2 = size_p2::size((size_p2 *)(in_RDI + 0x28));
  auVar4 = vcvtusi2sd_avx512f(auVar4,uVar2 * 0x50);
  auVar5._0_8_ = auVar4._0_8_ / 100.0;
  auVar5._8_8_ = auVar4._8_8_;
  uVar3 = vcvttsd2usi_avx512f(auVar5);
  *(undefined8 *)(in_RDI + 0x20) = uVar3;
  size_p2::size((size_p2 *)(in_RDI + 0x28));
  std::
  vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ::resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

explicit standard_hash_table(uint32_t capa_bits) {
        capa_size_ = size_p2(std::max(min_capa_bits, capa_bits));
        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);
        table_.resize(capa_size_.size());
    }